

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O3

void __thiscall TPZFront<float>::TPZFront(TPZFront<float> *this,void **vtt,TPZFront<float> *cp)

{
  ulong uVar1;
  long *plVar2;
  int *piVar3;
  pointer ptVar4;
  pointer ptVar5;
  long *plVar6;
  int *piVar7;
  STensorProductMTData *pSVar8;
  ulong uVar9;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)*vtt;
  this->fMaxFront = cp->fMaxFront;
  (this->fGlobal).super_TPZVec<long>.fStore = (long *)0x0;
  (this->fGlobal).super_TPZVec<long>.fNElements = 0;
  (this->fGlobal).super_TPZVec<long>.fNAlloc = 0;
  (this->fGlobal).super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a058;
  uVar1 = (cp->fGlobal).super_TPZVec<long>.fNElements;
  if ((long)uVar1 < 0xb) {
    plVar6 = (this->fGlobal).fExtAlloc;
    (this->fGlobal).super_TPZVec<long>.fStore = plVar6;
    (this->fGlobal).super_TPZVec<long>.fNElements = uVar1;
    (this->fGlobal).super_TPZVec<long>.fNAlloc = 0;
    if (0 < (long)uVar1) goto LAB_012b78e2;
  }
  else {
    plVar6 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    (this->fGlobal).super_TPZVec<long>.fStore = plVar6;
    (this->fGlobal).super_TPZVec<long>.fNElements = uVar1;
    (this->fGlobal).super_TPZVec<long>.fNAlloc = uVar1;
LAB_012b78e2:
    plVar2 = (cp->fGlobal).super_TPZVec<long>.fStore;
    uVar9 = 0;
    do {
      plVar6[uVar9] = plVar2[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  TPZVec<long>::TPZVec(&this->fLocal,&cp->fLocal);
  this->fFront = cp->fFront;
  (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fStore = (int *)0x0;
  (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements = 0;
  (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc = 0;
  (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a018;
  uVar1 = (cp->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
  if ((long)uVar1 < 0xb) {
    piVar7 = (this->fFree).super_TPZManVector<int,_10>.fExtAlloc;
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fStore = piVar7;
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements = uVar1;
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc = 0;
    if ((long)uVar1 < 1) goto LAB_012b79c5;
  }
  else {
    piVar7 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fStore = piVar7;
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements = uVar1;
    (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fNAlloc = uVar1;
  }
  piVar3 = (cp->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>.fStore;
  uVar9 = 0;
  do {
    piVar7[uVar9] = piVar3[uVar9];
    uVar9 = uVar9 + 1;
  } while (uVar1 != uVar9);
LAB_012b79c5:
  (this->fFree).super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0181a3d0;
  TPZVec<float>::TPZVec(&this->fData,&cp->fData);
  this->fDecomposeType = cp->fDecomposeType;
  this->fNextRigidBodyMode = cp->fNextRigidBodyMode;
  this->fExpandRatio = cp->fExpandRatio;
  pSVar8 = cp->fProductMTData;
  if (pSVar8 == (STensorProductMTData *)0x0) {
    pSVar8 = (STensorProductMTData *)0x0;
  }
  else {
    ptVar4 = (pSVar8->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar5 = (pSVar8->fThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar8 = (STensorProductMTData *)operator_new(0x110);
    STensorProductMTData::STensorProductMTData
              (pSVar8,(int)((ulong)((long)ptVar5 - (long)ptVar4) >> 3),this);
  }
  this->fProductMTData = pSVar8;
  return;
}

Assistant:

TPZFront<TVar>::TPZFront(const TPZFront<TVar> &cp) : fMaxFront(cp.fMaxFront),
fGlobal(cp.fGlobal), fLocal(cp.fLocal),fFront(cp.fFront),fFree(cp.fFree),
fData(cp.fData),
fDecomposeType(cp.fDecomposeType)
{
	fNextRigidBodyMode = cp.fNextRigidBodyMode;
	fExpandRatio = cp.fExpandRatio;
	if (cp.fProductMTData) {
		const int nthreads = cp.fProductMTData->NThreads();
		this->fProductMTData = new STensorProductMTData(nthreads,this);
	}
	else {
		this->fProductMTData = NULL;
	}
}